

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O1

json_string * NumberToString::_itoa<long_long>(json_string *__return_storage_ptr__,longlong val)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  byte *__s;
  byte *__s_00;
  char num_str_result [22];
  byte local_25 [13];
  
  local_25[2] = 0;
  uVar3 = -val;
  __s_00 = local_25 + 1;
  if (0 < val) {
    uVar3 = val;
  }
  do {
    __s = __s_00;
    *__s = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    __s_00 = __s + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (val < 0) {
    *__s_00 = 0x2d;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen((char *)__s_00);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s_00,__s_00 + sVar2);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen((char *)__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s_00 + sVar2 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _itoa(T val) json_nothrow {		
	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
	   #else
		  json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
	   #endif
	   num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
	   json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];
	   bool negative;

	   START_MEM_SCOPE
	   long value = (long)val;
	   //first thing, check if it's negative, if so, make it positive
	   if (value < 0){
		  value = -value;
		  negative = true;
	   } else {
		  negative = false;
	   }

	   //create the string
	   do {
		  *runner-- = (json_char)(value % 10) + JSON_TEXT('0');
	   } while(value /= 10);
	   END_MEM_SCOPE

	   //if it's negative, add the negation
	   if (negative){
		  *runner = JSON_TEXT('-');
		  return json_string(runner);
	   }
	   return json_string(runner + 1);
    }